

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_conv_1d_1s(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *extraout_RAX;
  ggml_tensor *in_RCX;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *unaff_RBX;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *unaff_R14;
  int ne [4];
  int iStack_50;
  int iStack_4c;
  undefined8 uStack_48;
  ggml_tensor *pgStack_38;
  ggml_tensor *pgStack_30;
  int local_28;
  int local_24;
  undefined8 local_20;
  
  if ((b->ne[2] == 1) && (unaff_RBX = b, b->ne[3] == 1)) {
    unaff_R14 = a;
    if (a->ne[1] != b->ne[1]) goto LAB_001260bf;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
        local_28 = b->ne[0];
        local_24 = a->ne[2];
        local_20 = 0x100000001;
        pgStack_30 = (ggml_tensor *)0x126096;
        pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&local_28,(void *)0x0);
        pgVar1->op = GGML_OP_CONV_1D_1S;
        pgVar1->grad = (ggml_tensor *)0x0;
        pgVar1->src0 = a;
        pgVar1->src1 = b;
        return pgVar1;
      }
      goto LAB_001260ba;
    }
  }
  else {
    pgStack_30 = (ggml_tensor *)0x1260ba;
    ggml_conv_1d_1s_cold_1();
    b = unaff_RBX;
LAB_001260ba:
    pgStack_30 = (ggml_tensor *)0x1260bf;
    ggml_conv_1d_1s_cold_4();
LAB_001260bf:
    pgStack_30 = (ggml_tensor *)0x1260c4;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_30 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_38 = b;
  pgStack_30 = unaff_R14;
  if ((extraout_RDX->ne[2] == 1) && (extraout_RDX->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX->ne[1]) {
      if (a->ne[3] != 1) goto LAB_00126169;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
        iStack_50 = extraout_RDX->ne[0] / 2;
        iStack_4c = a->ne[2];
        uStack_48 = 0x100000001;
        pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_50,(void *)0x0);
        pgVar1->op = GGML_OP_CONV_1D_2S;
        pgVar1->grad = (ggml_tensor *)0x0;
        pgVar1->src0 = a;
        pgVar1->src1 = extraout_RDX;
        return pgVar1;
      }
      goto LAB_0012615f;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_0012615f:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_00126169:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_00->ne[0] == a->ne[0]) && (extraout_RDX_00->ne[2] == a->ne[2])) &&
     (extraout_RDX_00->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) &&
       (in_RCX->grad == (ggml_tensor *)0x0)) {
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar1->op = GGML_OP_FLASH_ATTN;
      pgVar1->grad = (ggml_tensor *)0x0;
      pgVar1->src0 = a;
      pgVar1->src1 = extraout_RDX_00;
      pgVar1->opt[0] = in_RCX;
      pgVar2 = ggml_new_i32(ctx,(uint)in_R8 & 0xff);
      pgVar1->opt[1] = pgVar2;
      return pgVar1;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_01->ne[0] == a->ne[0]) && (extraout_RDX_01->ne[2] == a->ne[2])) &&
     (extraout_RDX_01->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) &&
        (in_RCX->grad == (ggml_tensor *)0x0)) &&
       ((in_R8->grad == (ggml_tensor *)0x0 && (in_R9->grad == (ggml_tensor *)0x0)))) {
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar1->op = GGML_OP_FLASH_FF;
      pgVar1->grad = (ggml_tensor *)0x0;
      pgVar1->src0 = a;
      pgVar1->src1 = extraout_RDX_01;
      pgVar1->opt[0] = in_RCX;
      pgVar1->opt[1] = in_R8;
      pgVar1->opt[2] = in_R9;
      return pgVar1;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar1;
    return pgVar1;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_conv_1d_1s(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[1] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);
    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[4] = { b->ne[0], a->ne[2], 1, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 2, ne);

    result->op   = GGML_OP_CONV_1D_1S;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}